

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

Status * __thiscall
draco::PlyReader::ParseHeader(Status *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  int iVar1;
  bool bVar2;
  PlyReader *this_00;
  StatusOr<bool> _statusor78;
  StatusOr<bool> _statusor85;
  undefined1 local_90 [40];
  bool local_68;
  int local_60;
  string local_58 [32];
  char local_38;
  
  this_00 = this;
  while( true ) {
    ParseEndHeader((StatusOr<bool> *)local_90,this_00,buffer);
    if (local_90._0_4_ != OK) {
      Status::Status(__return_storage_ptr__,(Status *)local_90);
      std::__cxx11::string::~string((string *)(local_90 + 8));
      return __return_storage_ptr__;
    }
    if (local_68 == true) break;
    this_00 = (PlyReader *)buffer;
    bVar2 = ParseElement(this,buffer);
    if (bVar2) {
      std::__cxx11::string::~string((string *)(local_90 + 8));
    }
    else {
      this_00 = this;
      ParseProperty((StatusOr<bool> *)&local_60,this,buffer);
      iVar1 = local_60;
      if (local_60 == 0) {
        if (local_38 == '\0') {
          parser::SkipLine(buffer);
        }
      }
      else {
        this_00 = (PlyReader *)&local_60;
        Status::Status(__return_storage_ptr__,(Status *)&local_60);
      }
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string((string *)(local_90 + 8));
      if (iVar1 != 0) {
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::string::~string((string *)(local_90 + 8));
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PlyReader::ParseHeader(DecoderBuffer *buffer) {
  while (true) {
    DRACO_ASSIGN_OR_RETURN(bool end, ParseEndHeader(buffer));
    if (end) {
      break;
    }
    if (ParseElement(buffer)) {
      continue;
    }
    DRACO_ASSIGN_OR_RETURN(bool property_parsed, ParseProperty(buffer));
    if (property_parsed) {
      continue;
    }
    parser::SkipLine(buffer);
  }
  return OkStatus();
}